

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_FunctionPointerReturnValue_Test::
~TEST_MockReturnValueTest_FunctionPointerReturnValue_Test
          (TEST_MockReturnValueTest_FunctionPointerReturnValue_Test *this)

{
  TEST_MockReturnValueTest_FunctionPointerReturnValue_Test *this_local;
  
  ~TEST_MockReturnValueTest_FunctionPointerReturnValue_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockReturnValueTest, FunctionPointerReturnValue)
{
    void (*ptr)() = (void(*)()) 0x00107;
    mock().expectOneCall("foo").andReturnValue(ptr);
    MockActualCall& actual_call = mock().actualCall("foo");

    FUNCTIONPOINTERS_EQUAL(ptr, actual_call.returnValue().getFunctionPointerValue());
    FUNCTIONPOINTERS_EQUAL(ptr, actual_call.returnFunctionPointerValue());
    FUNCTIONPOINTERS_EQUAL(ptr, mock().functionPointerReturnValue());
}